

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O0

int __thiscall
TRootHandler_TVFS::IsVfsSubDirectory
          (TRootHandler_TVFS *this,TCascStorage *hs,TVFS_DIRECTORY_HEADER *DirHeader,
          TVFS_DIRECTORY_HEADER *SubHeader,ENCODED_KEY *EKey,DWORD dwFileSize)

{
  bool bVar1;
  int local_50;
  DWORD local_4c;
  int nError;
  DWORD cbVfsData;
  LPBYTE pbVfsData;
  ENCODED_KEY *pEStack_38;
  DWORD dwFileSize_local;
  ENCODED_KEY *EKey_local;
  TVFS_DIRECTORY_HEADER *SubHeader_local;
  TVFS_DIRECTORY_HEADER *DirHeader_local;
  TCascStorage *hs_local;
  TRootHandler_TVFS *this_local;
  
  _nError = (LPBYTE)0x0;
  local_50 = 1000;
  local_4c = dwFileSize;
  pbVfsData._4_4_ = dwFileSize;
  pEStack_38 = EKey;
  EKey_local = (ENCODED_KEY *)SubHeader;
  SubHeader_local = DirHeader;
  DirHeader_local = (TVFS_DIRECTORY_HEADER *)hs;
  hs_local = (TCascStorage *)this;
  bVar1 = IsVfsFileEKey(this,hs,EKey,(ulong)DirHeader->EKeySize);
  if (((bVar1) &&
      (_nError = LoadInternalFileToMemory
                           ((TCascStorage *)DirHeader_local,pEStack_38->Value,2,&local_4c),
      _nError != (LPBYTE)0x0)) && (local_4c != 0)) {
    local_50 = CaptureDirectoryHeader
                         ((TVFS_DIRECTORY_HEADER *)EKey_local,_nError,_nError + local_4c);
    if (local_50 == 0) {
      return 0;
    }
    memset(EKey_local,0,0x48);
    free(_nError);
  }
  return local_50;
}

Assistant:

int IsVfsSubDirectory(TCascStorage * hs,  TVFS_DIRECTORY_HEADER & DirHeader, TVFS_DIRECTORY_HEADER & SubHeader, ENCODED_KEY & EKey, DWORD dwFileSize)
    {
        LPBYTE pbVfsData = NULL;
        DWORD cbVfsData = dwFileSize;
        int nError = ERROR_BAD_FORMAT;

        // Verify whether the EKey is in the list of VFS root files
        if(IsVfsFileEKey(hs, EKey, DirHeader.EKeySize))
        {
            // Load the entire file into memory
            pbVfsData = LoadInternalFileToMemory(hs, EKey.Value, CASC_OPEN_BY_EKEY, &cbVfsData);
            if (pbVfsData && cbVfsData)
            {
                // Capture the file folder. This also serves as test
                nError = CaptureDirectoryHeader(SubHeader, pbVfsData, pbVfsData + cbVfsData);
                if (nError == ERROR_SUCCESS)
                    return nError;

                // Clear the captured header
                memset(&SubHeader, 0, sizeof(TVFS_DIRECTORY_HEADER));
                CASC_FREE(pbVfsData);
            }
        }

        return nError;
    }